

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int cvLsPSetup(void *cvode_mem)

{
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  int retval;
  CVodeMem *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int local_4;
  
  local_4 = cvLs_AccessLMem((void *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                            in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(CVLsMem *)0xefcbf2)
  ;
  if (local_4 == 0) {
    local_4 = (*(code *)in_stack_ffffffffffffffd8[0x1a])
                        (*(undefined8 *)(in_stack_ffffffffffffffe0 + 0x168),
                         *(undefined8 *)(in_stack_ffffffffffffffe0 + 0x288),
                         in_stack_ffffffffffffffd8[0xe],in_stack_ffffffffffffffd8[0xf],
                         (*(int *)(in_stack_ffffffffffffffd8 + 4) != 0 ^ 0xffU) & 1,
                         in_stack_ffffffffffffffe0 + 0x448,in_stack_ffffffffffffffd8[0x1d]);
  }
  return local_4;
}

Assistant:

int cvLsPSetup(void *cvode_mem)
{
  int      retval;
  CVodeMem cv_mem;
  CVLsMem  cvls_mem;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, "cvLsPSetup",
                           &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS)  return(retval);

  /* Call user pset routine to update preconditioner and possibly
     reset jcur (pass !jbad as update suggestion) */
  retval = cvls_mem->pset(cv_mem->cv_tn, cvls_mem->ycur,
                          cvls_mem->fcur, !(cvls_mem->jbad),
                          &cv_mem->cv_jcur, cv_mem->cv_gamma,
                          cvls_mem->P_data);
  return(retval);
}